

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

void __thiscall
Glucose::OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::clean
          (OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *this,
          int *idx)

{
  vec<unsigned_int> *pvVar1;
  uint uVar2;
  vec<unsigned_int> *pvVar3;
  uint *puVar4;
  uint *puVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  pvVar3 = (this->occs).data;
  pvVar1 = pvVar3 + *idx;
  iVar8 = pvVar3[*idx].sz;
  if (iVar8 < 1) {
    iVar7 = 0;
  }
  else {
    puVar4 = pvVar1->data;
    puVar5 = (((this->deleted).ca)->super_RegionAllocator<unsigned_int>).memory;
    lVar6 = 0;
    iVar7 = 0;
    do {
      uVar2 = puVar4[lVar6];
      if ((puVar5[uVar2] & 3) != 1) {
        lVar9 = (long)iVar7;
        iVar7 = iVar7 + 1;
        puVar4[lVar9] = uVar2;
      }
      lVar6 = lVar6 + 1;
      iVar8 = pvVar1->sz;
    } while (lVar6 < iVar8);
    iVar7 = (int)lVar6 - iVar7;
  }
  if (0 < iVar7) {
    pvVar1->sz = iVar8 - iVar7;
  }
  (this->dirty).data[*idx] = '\0';
  return;
}

Assistant:

void OccLists<Idx,Vec,Deleted>::clean(const Idx& idx)
{
    Vec& vec = occs[toInt(idx)];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[toInt(idx)] = 0;
}